

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Validator.cpp
# Opt level: O3

void Validator::printEvaluation(Solution *solution)

{
  ostream *poVar1;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"S1 : ",5);
  constraintS1(solution);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  constraintS1(solution);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"S2 : ",5);
  constraintS2(solution);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  constraintS2(solution);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"S3 : ",5);
  constraintS3(solution);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  constraintS3(solution);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"S4 : ",5);
  constraintS4(solution);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  constraintS4(solution);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"S5 : ",5);
  constraintS5(solution);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  constraintS5(solution);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"S6 : ",5);
  constraintS6(solution);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  constraintS6(solution);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"S7 : ",5);
  constraintS7(solution);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  constraintS7(solution);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Sum : ",6);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  return;
}

Assistant:

void Validator::printEvaluation(const Solution &solution){
    unsigned int sum = 0;

    cout << "S1 : " << constraintS1(solution) << endl;
    sum += constraintS1(solution);
    cout << "S2 : " << constraintS2(solution) << endl;
    sum += constraintS2(solution);
    cout << "S3 : " << constraintS3(solution) << endl;
    sum += constraintS3(solution);
    cout << "S4 : " << constraintS4(solution) << endl;
    sum += constraintS4(solution);
    cout << "S5 : " << constraintS5(solution) << endl;
    sum += constraintS5(solution);
    cout << "S6 : " << constraintS6(solution) << endl;
    sum += constraintS6(solution);
    cout << "S7 : " << constraintS7(solution) << endl;
    sum += constraintS7(solution);


    cout << "Sum : " << sum << endl;
}